

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int nonce_function_0(uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,
                    uchar *algo,size_t algolen,void *data)

{
  void *in_RDI;
  
  memset(in_RDI,0,0x20);
  return 1;
}

Assistant:

static int nonce_function_0(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    (void) msg;
    (void) msglen;
    (void) key32;
    (void) xonly_pk32;
    (void) algo;
    (void) algolen;
    (void) data;

    memset(nonce32, 0, 32);
    return 1;
}